

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_matlab.cc
# Opt level: O0

void lf::io::writeMatlab(Mesh *mesh,string *filename)

{
  Entity *pEVar1;
  byte bVar2;
  bool bVar3;
  RefElType RVar4;
  RefElType RVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  size_type sVar9;
  reference pvVar10;
  ostream *poVar11;
  runtime_error *prVar12;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *psVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Scalar *pSVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  reference ppEVar15;
  undefined4 extraout_var_04;
  reference ppEVar16;
  string local_b78;
  allocator<char> local_b51;
  string local_b50;
  allocator<char> local_b29;
  string local_b28;
  stringstream local_b08 [8];
  stringstream ss_3;
  ostream local_af8 [383];
  RefEl local_979;
  undefined1 auStack_978 [7];
  RefEl ref_el_1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> sub_ent_1;
  glb_idx_t cell_index;
  Entity *e;
  iterator __end3_2;
  iterator __begin3_2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3_2;
  size_type quad_cnt;
  size_type triag_cnt;
  size_type cell_cnt;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> sub_ent;
  allocator<char> local_8e1;
  string local_8e0;
  allocator<char> local_8b9;
  string local_8b8;
  stringstream local_898 [8];
  stringstream ss_2;
  ostream local_888 [378];
  RefEl local_70e;
  RefEl local_70d;
  int local_70c;
  RefEl ref_el;
  Entity *pEStack_708;
  glb_idx_t edge_index;
  Entity *edge;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3_1;
  size_type ed_cnt;
  size_type no_of_edges;
  allocator<char> local_6a1;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  stringstream local_658 [8];
  stringstream ss_1;
  ostream local_648 [376];
  undefined1 local_4d0 [8];
  MatrixXd node_coord;
  Geometry *geo_ptr;
  glb_idx_t node_index;
  Entity *node;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  size_type node_cnt;
  size_type no_of_nodes;
  undefined1 local_460 [4];
  dim_t node_codim;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410;
  stringstream local_3f0 [8];
  stringstream ss;
  ostream local_3e0 [380];
  int local_264;
  ostream local_260 [4];
  dim_t dim_mesh;
  ofstream file;
  size_type fn_len;
  undefined1 local_30 [8];
  MatrixXd zero;
  string *filename_local;
  Mesh *mesh_local;
  
  zero.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)filename;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((ConstantReturnType *)&fn_len,0,1);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_30,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)&fn_len);
  sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (filename);
  if (((1 < sVar9) &&
      (pvVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](filename,sVar9 - 2), *pvVar10 != '.')) &&
     (pvVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator[](filename,sVar9 - 1), *pvVar10 != 'm')) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (filename,".m");
  }
  std::ofstream::ofstream(local_260,(string *)filename,_S_out);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (filename);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (filename);
    poVar11 = std::operator<<(local_260,"function [x,y,TRI,QUAD,EDS] = ");
    poVar11 = std::operator<<(poVar11,(string *)filename);
    poVar11 = std::operator<<(poVar11,"()");
    std::operator<<(poVar11,'\n');
    poVar11 = std::operator<<(local_260,"% Data for an unstructure planar hybrid 2D mesh");
    std::operator<<(poVar11,'\n');
    local_264 = (**mesh->_vptr_Mesh)();
    if (local_264 != 2) {
      std::__cxx11::stringstream::stringstream(local_3f0);
      std::operator<<(local_3e0,"write_matlab() only avvailable for 2D meshes");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_410,"dim_mesh == 2",&local_411);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/write_matlab.cc"
                 ,&local_439);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_410,&local_438,0x23,(string *)local_460);
      std::__cxx11::string::~string((string *)local_460);
      std::__cxx11::string::~string((string *)&local_438);
      std::allocator<char>::~allocator(&local_439);
      std::__cxx11::string::~string((string *)&local_410);
      std::allocator<char>::~allocator(&local_411);
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar12,"this code should not be reached");
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar6 = (*mesh->_vptr_Mesh[3])(mesh,2);
    psVar13 = (span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)(ulong)uVar6;
    poVar11 = std::operator<<(local_260,"x = zeros(");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,(ulong)psVar13);
    poVar11 = std::operator<<(poVar11,",1);");
    std::operator<<(poVar11,'\n');
    poVar11 = std::operator<<(local_260,"y = zeros(");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,(ulong)psVar13);
    poVar11 = std::operator<<(poVar11,",1);");
    std::operator<<(poVar11,'\n');
    __range3 = (span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)0x0;
    iVar7 = (*mesh->_vptr_Mesh[2])(mesh,2);
    __begin3._M_current = (Entity **)CONCAT44(extraout_var,iVar7);
    __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    node = (Entity *)
           std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    while (bVar3 = __gnu_cxx::
                   operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                             (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                       *)&node), ((bVar3 ^ 0xffU) & 1) != 0) {
      ppEVar15 = __gnu_cxx::
                 __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                 ::operator*(&__end3);
      pEVar1 = *ppEVar15;
      iVar7 = (*mesh->_vptr_Mesh[5])(mesh,pEVar1);
      iVar8 = (*pEVar1->_vptr_Entity[3])();
      node_coord.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           CONCAT44(extraout_var_00,iVar8);
      (**(code **)(*(long *)node_coord.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols + 0x18))
                (local_4d0,
                 node_coord.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols,local_30);
      poVar11 = std::operator<<(local_260,"x(");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7 + 1);
      poVar11 = std::operator<<(poVar11,") = ");
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_4d0
                           ,0,0);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pSVar14);
      poVar11 = std::operator<<(poVar11,"; ");
      std::operator<<(poVar11,'\n');
      poVar11 = std::operator<<(local_260,"y(");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7 + 1);
      poVar11 = std::operator<<(poVar11,") = ");
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_4d0
                           ,1,0);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pSVar14);
      poVar11 = std::operator<<(poVar11,"; ");
      std::operator<<(poVar11,'\n');
      __range3 = (span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                 ((long)&__range3->_M_ptr + 1);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_4d0);
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end3);
    }
    if (__range3 != psVar13) {
      std::__cxx11::stringstream::stringstream(local_658);
      std::operator<<(local_648,"Node count mismatch");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_678,"node_cnt == no_of_nodes",&local_679);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/write_matlab.cc"
                 ,&local_6a1);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_678,&local_6a0,0x38,(string *)&no_of_edges);
      std::__cxx11::string::~string((string *)&no_of_edges);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::allocator<char>::~allocator(&local_6a1);
      std::__cxx11::string::~string((string *)&local_678);
      std::allocator<char>::~allocator(&local_679);
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar12,"this code should not be reached");
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar6 = (*mesh->_vptr_Mesh[3])(mesh,1);
    poVar11 = std::operator<<(local_260,"EDS = zeros(");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,(ulong)uVar6);
    poVar11 = std::operator<<(poVar11,",2);");
    std::operator<<(poVar11,'\n');
    iVar7 = (*mesh->_vptr_Mesh[2])(mesh,1);
    __begin3_1._M_current = (Entity **)CONCAT44(extraout_var_01,iVar7);
    __end3_1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3_1
                         );
    edge = (Entity *)
           std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3_1);
    while (bVar3 = __gnu_cxx::
                   operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                             (&__end3_1,
                              (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                               *)&edge), ((bVar3 ^ 0xffU) & 1) != 0) {
      ppEVar15 = __gnu_cxx::
                 __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                 ::operator*(&__end3_1);
      pEStack_708 = *ppEVar15;
      local_70c = (*mesh->_vptr_Mesh[5])(mesh,pEStack_708);
      iVar7 = (*pEStack_708->_vptr_Entity[4])();
      local_70d.type_ = (RefElType)iVar7;
      RVar5 = lf::base::RefEl::operator_cast_to_RefElType(&local_70d);
      local_70e = lf::base::RefEl::kSegment();
      RVar4 = lf::base::RefEl::operator_cast_to_RefElType(&local_70e);
      if (RVar5 != RVar4) {
        std::__cxx11::stringstream::stringstream(local_898);
        std::operator<<(local_888,"Edge must be a segment");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8b8,"ref_el == lf::base::RefEl::kSegment()",&local_8b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/write_matlab.cc"
                   ,&local_8e1);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_8b8,&local_8e0,0x42,(string *)&sub_ent._M_extent);
        std::__cxx11::string::~string((string *)&sub_ent._M_extent);
        std::__cxx11::string::~string((string *)&local_8e0);
        std::allocator<char>::~allocator(&local_8e1);
        std::__cxx11::string::~string((string *)&local_8b8);
        std::allocator<char>::~allocator(&local_8b9);
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar12,"this code should not be reached");
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar7 = (*pEStack_708->_vptr_Entity[1])(pEStack_708,1);
      cell_cnt = CONCAT44(extraout_var_02,iVar7);
      poVar11 = std::operator<<(local_260,"EDS(");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_70c + 1);
      poVar11 = std::operator<<(poVar11,",:) = [");
      ppEVar16 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&cell_cnt
                            ,0);
      iVar7 = (*mesh->_vptr_Mesh[5])(mesh,*ppEVar16);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7 + 1);
      poVar11 = std::operator<<(poVar11,", ");
      ppEVar16 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&cell_cnt
                            ,1);
      iVar7 = (*mesh->_vptr_Mesh[5])(mesh,*ppEVar16);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7 + 1);
      poVar11 = std::operator<<(poVar11,"];");
      std::operator<<(poVar11,'\n');
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end3_1);
    }
    poVar11 = std::operator<<(local_260,"TRI = []; QUAD = [];");
    std::operator<<(poVar11,'\n');
    quad_cnt = 0;
    __range3_2 = (span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)0x0;
    iVar7 = (*mesh->_vptr_Mesh[2])(mesh,0);
    __begin3_2._M_current = (Entity **)CONCAT44(extraout_var_03,iVar7);
    __end3_2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3_2
                         );
    e = (Entity *)
        std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                  ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3_2);
    while (bVar3 = __gnu_cxx::
                   operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                             (&__end3_2,
                              (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                               *)&e), ((bVar3 ^ 0xffU) & 1) != 0) {
      ppEVar15 = __gnu_cxx::
                 __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                 ::operator*(&__end3_2);
      pEVar1 = *ppEVar15;
      uVar6 = (*mesh->_vptr_Mesh[5])(mesh,pEVar1);
      iVar7 = (*pEVar1->_vptr_Entity[1])(pEVar1,2);
      _auStack_978 = (pointer)CONCAT44(extraout_var_04,iVar7);
      iVar7 = (*pEVar1->_vptr_Entity[4])();
      local_979.type_ = (RefElType)iVar7;
      RVar5 = lf::base::RefEl::operator_cast_to_RefElType(&local_979);
      if (RVar5 == kTria) {
        poVar11 = std::operator<<(local_260,"TRI(");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,quad_cnt + 1);
        poVar11 = std::operator<<(poVar11,",:) = [");
        ppEVar16 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              auStack_978,0);
        iVar7 = (*mesh->_vptr_Mesh[5])(mesh,*ppEVar16);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7 + 1);
        poVar11 = std::operator<<(poVar11,", ");
        ppEVar16 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              auStack_978,1);
        iVar7 = (*mesh->_vptr_Mesh[5])(mesh,*ppEVar16);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7 + 1);
        poVar11 = std::operator<<(poVar11,", ");
        ppEVar16 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              auStack_978,2);
        iVar7 = (*mesh->_vptr_Mesh[5])(mesh,*ppEVar16);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7 + 1);
        poVar11 = std::operator<<(poVar11,", ");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar6);
        poVar11 = std::operator<<(poVar11," ];");
        std::operator<<(poVar11,'\n');
        quad_cnt = quad_cnt + 1;
      }
      else {
        if (RVar5 != kQuad) {
          std::__cxx11::stringstream::stringstream(local_b08);
          std::operator<<(local_af8,"write_matlab can only handle triangles and quads");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b28,"false",&local_b29);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b50,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/write_matlab.cc"
                     ,&local_b51);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_b28,&local_b50,0x6b,&local_b78);
          std::__cxx11::string::~string((string *)&local_b78);
          std::__cxx11::string::~string((string *)&local_b50);
          std::allocator<char>::~allocator(&local_b51);
          std::__cxx11::string::~string((string *)&local_b28);
          std::allocator<char>::~allocator(&local_b29);
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar12,"this code should not be reached");
          __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        poVar11 = std::operator<<(local_260,"QUAD(");
        poVar11 = (ostream *)
                  std::ostream::operator<<(poVar11,(ulong)((long)&__range3_2->_M_ptr + 1));
        poVar11 = std::operator<<(poVar11,",:) = [");
        ppEVar16 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              auStack_978,0);
        iVar7 = (*mesh->_vptr_Mesh[5])(mesh,*ppEVar16);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7 + 1);
        poVar11 = std::operator<<(poVar11,", ");
        ppEVar16 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              auStack_978,1);
        iVar7 = (*mesh->_vptr_Mesh[5])(mesh,*ppEVar16);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7 + 1);
        poVar11 = std::operator<<(poVar11,", ");
        ppEVar16 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              auStack_978,2);
        iVar7 = (*mesh->_vptr_Mesh[5])(mesh,*ppEVar16);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7 + 1);
        poVar11 = std::operator<<(poVar11,", ");
        ppEVar16 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              auStack_978,3);
        iVar7 = (*mesh->_vptr_Mesh[5])(mesh,*ppEVar16);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7 + 1);
        poVar11 = std::operator<<(poVar11,", ");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar6);
        poVar11 = std::operator<<(poVar11," ];");
        std::operator<<(poVar11,'\n');
        __range3_2 = (span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                     ((long)&__range3_2->_M_ptr + 1);
      }
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end3_2);
    }
  }
  std::ofstream::~ofstream(local_260);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_30);
  return;
}

Assistant:

void writeMatlab(const lf::mesh::Mesh& mesh, std::string filename) {
  using size_type = std::size_t;         // unsigned integer
  using dim_t = lf::base::RefEl::dim_t;  // type for dimensions
  const Eigen::MatrixXd zero(Eigen::MatrixXd::Zero(0, 1));

  // Preprocess filename: append .m, if not there already
  {
    const size_type fn_len = filename.size();
    if ((fn_len > 1) && (filename[fn_len - 2] != '.') &&
        (filename[fn_len - 1] != 'm')) {
      filename += ".m";
    }
  }
  // Open file for writing
  std::ofstream file(filename);
  if (file.is_open()) {
    // Start regular writing operations
    // Remove trailing .m
    filename.pop_back();
    filename.pop_back();
    file << "function [x,y,TRI,QUAD,EDS] = " << filename << "()" << '\n';
    file << "% Data for an unstructure planar hybrid 2D mesh" << '\n';

    // Obtain topological dimension of the mesh
    const dim_t dim_mesh = mesh.DimMesh();
    LF_VERIFY_MSG(dim_mesh == 2,
                  "write_matlab() only avvailable for 2D meshes");

    // Run through the nodes of the mesh and write x coordinates
    const dim_t node_codim(dim_mesh);
    // Number of nodes of the mesh
    const size_type no_of_nodes = mesh.NumEntities(node_codim);
    file << "x = zeros(" << no_of_nodes << ",1);" << '\n';
    file << "y = zeros(" << no_of_nodes << ",1);" << '\n';

    // Write node coordinates to file
    size_type node_cnt = 0;
    for (const mesh::Entity* node : mesh.Entities(node_codim)) {
      const lf::base::glb_idx_t node_index = mesh.Index(*node);
      const geometry::Geometry* geo_ptr = node->Geometry();
      Eigen::MatrixXd node_coord(geo_ptr->Global(zero));
      file << "x(" << node_index + 1 << ") = " << node_coord(0, 0) << "; "
           << '\n';
      file << "y(" << node_index + 1 << ") = " << node_coord(1, 0) << "; "
           << '\n';
      node_cnt++;
    }
    LF_VERIFY_MSG(node_cnt == no_of_nodes, "Node count mismatch");

    // Write edge information to file
    const size_type no_of_edges = mesh.NumEntities(1);
    file << "EDS = zeros(" << no_of_edges << ",2);" << '\n';
    size_type ed_cnt = 0;
    for (const mesh::Entity* edge : mesh.Entities(1)) {
      const lf::base::glb_idx_t edge_index = mesh.Index(*edge);
      const base::RefEl ref_el = edge->RefEl();
      LF_VERIFY_MSG(ref_el == lf::base::RefEl::kSegment(),
                    "Edge must be a segment");
      // Access endpoints = sub-entities of relative co-dimension 1
      const auto sub_ent = edge->SubEntities(1);
      file << "EDS(" << edge_index + 1 << ",:) = ["
           << mesh.Index(*sub_ent[0]) + 1 << ", " << mesh.Index(*sub_ent[1]) + 1
           << "];" << '\n';
      ed_cnt++;
    }

    // Write cell (entities of co-dimension 0) information to file
    file << "TRI = []; QUAD = [];" << '\n';
    size_type cell_cnt = 0;
    size_type triag_cnt = 0;
    size_type quad_cnt = 0;
    for (const mesh::Entity* e : mesh.Entities(0)) {
      const lf::base::glb_idx_t cell_index = mesh.Index(*e);
      // Access vertices =  sub-entities of relative co-dimension 2
      const auto sub_ent = e->SubEntities(2);
      const base::RefEl ref_el = e->RefEl();
      switch (ref_el) {
        case lf::base::RefEl::kTria(): {
          file << "TRI(" << triag_cnt + 1 << ",:) = ["
               << mesh.Index(*sub_ent[0]) + 1 << ", "
               << mesh.Index(*sub_ent[1]) + 1 << ", "
               << mesh.Index(*sub_ent[2]) + 1 << ", " << cell_index << " ];"
               << '\n';
          triag_cnt++;
          break;
        }
        case lf::base::RefEl::kQuad(): {
          file << "QUAD(" << quad_cnt + 1 << ",:) = ["
               << mesh.Index(*sub_ent[0]) + 1 << ", "
               << mesh.Index(*sub_ent[1]) + 1 << ", "
               << mesh.Index(*sub_ent[2]) + 1 << ", "
               << mesh.Index(*sub_ent[3]) + 1 << ", " << cell_index << " ];"
               << '\n';
          quad_cnt++;
          break;
        }
        default: {
          LF_VERIFY_MSG(false,
                        "write_matlab can only handle triangles and quads");
          break;
        }
      }
      cell_cnt++;
    }
  }
}